

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

uintmax_t anon_unknown.dwarf_54f5::remove_all_aux(path *p,file_type type,error_code *ec)

{
  file_type type_00;
  reference pdVar1;
  uintmax_t uVar2;
  uintmax_t uVar3;
  directory_iterator itr;
  
  if (type == directory_file) {
    boost::filesystem::directory_iterator::directory_iterator(&itr,p);
    uVar3 = 1;
    while (itr.m_imp.px != (anonymous_namespace)::end_dir_itr) {
      pdVar1 = boost::filesystem::directory_iterator::dereference(&itr);
      type_00 = query_file_type(&pdVar1->m_path,ec);
      if ((ec != (error_code *)0x0) && (ec->m_val != 0)) {
        boost::detail::shared_count::~shared_count(&itr.m_imp.pn);
        return uVar3;
      }
      pdVar1 = boost::filesystem::directory_iterator::dereference(&itr);
      uVar2 = remove_all_aux(&pdVar1->m_path,type_00,ec);
      uVar3 = uVar3 + uVar2;
      boost::filesystem::directory_iterator::increment(&itr);
    }
    boost::detail::shared_count::~shared_count(&itr.m_imp.pn);
  }
  else {
    uVar3 = 1;
  }
  remove_file_or_directory(p,type,ec);
  return uVar3;
}

Assistant:

boost::uintmax_t remove_all_aux(const path& p, fs::file_type type,
    error_code* ec)
  {
    boost::uintmax_t count = 1;

    if (type == fs::directory_file)  // but not a directory symlink
    {
      for (fs::directory_iterator itr(p);
            itr != end_dir_itr; ++itr)
      {
        fs::file_type tmp_type = query_file_type(itr->path(), ec);
        if (ec != 0 && *ec)
          return count;
        count += remove_all_aux(itr->path(), tmp_type, ec);
      }
    }
    remove_file_or_directory(p, type, ec);
    return count;
  }